

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O3

Ptr __thiscall
TgBot::Api::sendVideoNote
          (Api *this,int64_t chatId,
          variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *videoNote,int64_t replyToMessageId,bool disableNotification,int32_t duration,
          int32_t length,
          variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *thumb,Ptr *replyMarkup)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pcVar5;
  result_type pnVar6;
  result_type pnVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000081;
  Ptr PVar8;
  Ptr *in_stack_00000020;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  get_visitor<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_2;
  bool local_91;
  ptree local_90;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> local_68;
  long local_48;
  string local_40;
  variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  
  local_48 = CONCAT71(in_register_00000081,disableNotification);
  local_91 = SUB41(duration,0);
  local_68.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20 = videoNote;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve(&local_68,8);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],long&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_68,
             (char (*) [8])0x25c0ca,(long *)&local_20);
  if (*(int *)replyToMessageId >> 0x1f == *(int *)replyToMessageId) {
    pnVar6 = boost::variant<std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>::
             apply_visitor<boost::detail::variant::get_visitor<std::shared_ptr<TgBot::InputFile>const>>
                       ((variant<std::shared_ptr<TgBot::InputFile>,std::__cxx11::string> *)
                        replyToMessageId,
                        (get_visitor<const_std::shared_ptr<TgBot::InputFile>_> *)&local_90);
    if (pnVar6 == (result_type)0x0) {
      local_90.m_data._M_dataplus._M_p = (pointer)&PTR__exception_002a4da0;
      boost::throw_exception<boost::bad_get>((bad_get *)&local_90);
    }
    peVar3 = (pnVar6->super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var4 = (pnVar6->super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    local_90.m_data._M_dataplus._M_p._0_1_ = 1;
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[11],std::__cxx11::string&,bool,std::__cxx11::string&,std::__cxx11::string&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_68,
               (char (*) [11])"video_note",&peVar3->data,(bool *)&local_90,&peVar3->mimeType,
               &peVar3->fileName);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
  }
  else {
    pnVar7 = boost::variant<std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>::
             apply_visitor<boost::detail::variant::get_visitor<std::__cxx11::string_const>>
                       ((variant<std::shared_ptr<TgBot::InputFile>,std::__cxx11::string> *)
                        replyToMessageId,
                        (get_visitor<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_90);
    if (pnVar7 == (result_type)0x0) {
      local_90.m_data._M_dataplus._M_p = (pointer)&PTR__exception_002a4da0;
      boost::throw_exception<boost::bad_get>((bad_get *)&local_90);
    }
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[11],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_68,
               (char (*) [11])"video_note",pnVar7);
  }
  if (local_91 == true) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[21],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_68,
               (char (*) [21])"disable_notification",&local_91);
  }
  if (length != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[9],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_68,
               (char (*) [9])0x25c43e,&length);
  }
  if ((int)thumb != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[7],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_68,
               (char (*) [7])"length",(int *)&thumb);
  }
  iVar2 = *(int *)&(replyMarkup->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
  if (iVar2 >> 0x1f == iVar2) {
    pnVar6 = boost::variant<std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>::
             apply_visitor<boost::detail::variant::get_visitor<std::shared_ptr<TgBot::InputFile>const>>
                       ((variant<std::shared_ptr<TgBot::InputFile>,std::__cxx11::string> *)
                        replyMarkup,
                        (get_visitor<const_std::shared_ptr<TgBot::InputFile>_> *)&local_90);
    if (pnVar6 == (result_type)0x0) {
      local_90.m_data._M_dataplus._M_p = (pointer)&PTR__exception_002a4da0;
      boost::throw_exception<boost::bad_get>((bad_get *)&local_90);
    }
    peVar3 = (pnVar6->super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var4 = (pnVar6->super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    local_90.m_data._M_dataplus._M_p._0_1_ = 1;
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[6],std::__cxx11::string&,bool,std::__cxx11::string&,std::__cxx11::string&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_68,
               (char (*) [6])"thumb",&peVar3->data,(bool *)&local_90,&peVar3->mimeType,
               &peVar3->fileName);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
  }
  else {
    pnVar7 = boost::variant<std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>::
             apply_visitor<boost::detail::variant::get_visitor<std::__cxx11::string_const>>
                       ((variant<std::shared_ptr<TgBot::InputFile>,std::__cxx11::string> *)
                        replyMarkup,
                        (get_visitor<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_40);
    if (pnVar7 == (result_type)0x0) {
      local_40._M_dataplus._M_p = (pointer)&PTR__exception_002a4da0;
      boost::throw_exception<boost::bad_get>((bad_get *)&local_40);
    }
    paVar1 = &local_90.m_data.field_2;
    pcVar5 = (pnVar7->_M_dataplus)._M_p;
    local_90.m_data._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar5,pcVar5 + pnVar7->_M_string_length);
    if (local_90.m_data._M_string_length != 0) {
      std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
      emplace_back<char_const(&)[6],std::__cxx11::string&>
                ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_68,
                 (char (*) [6])"thumb",&local_90.m_data);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.m_data._M_dataplus._M_p != paVar1) {
      operator_delete(local_90.m_data._M_dataplus._M_p);
    }
  }
  if ((in_stack_00000020->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr != (element_type *)0x0) {
    TgTypeParser::parseGenericReply_abi_cxx11_
              (&local_90.m_data,(TgTypeParser *)(chatId + 0x28),in_stack_00000020);
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[13],std::__cxx11::string>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_68,
               (char (*) [13])"reply_markup",&local_90.m_data);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.m_data._M_dataplus._M_p != &local_90.m_data.field_2) {
      operator_delete(local_90.m_data._M_dataplus._M_p);
    }
  }
  if (local_48 != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[20],long&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_68,
               (char (*) [20])"reply_to_message_id",&local_48);
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"sendVideoNote","");
  sendRequest(&local_90,(Api *)chatId,&local_40,&local_68);
  TgTypeParser::parseJsonAndGetMessage((TgTypeParser *)this,(ptree *)(chatId + 0x28));
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&local_68);
  PVar8.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar8.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Ptr)PVar8.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Message::Ptr Api::sendVideoNote(int64_t chatId, const boost::variant<InputFile::Ptr, std::string> videoNote, int64_t replyToMessageId, bool disableNotification, int32_t duration, int32_t length, const boost::variant<InputFile::Ptr, std::string> thumb, const GenericReply::Ptr replyMarkup) const {
    vector<HttpReqArg> args;
    args.reserve(8);
    args.emplace_back("chat_id", chatId);
    if (videoNote.which() == 0 /* InputFile::Ptr */) {
        auto file = boost::get<InputFile::Ptr>(videoNote);
        args.emplace_back("video_note", file->data, true, file->mimeType, file->fileName);
    } else /* std::string */ {
        args.emplace_back("video_note", boost::get<std::string>(videoNote));
    }
    if (disableNotification) {
        args.emplace_back("disable_notification", disableNotification);
    }
    if (duration) {
        args.emplace_back("duration", duration);
    }
    if (length) {
        args.emplace_back("length", length);
    }
    if (thumb.which() == 0 /* InputFile::Ptr */) {
        auto file = boost::get<InputFile::Ptr>(thumb);
        args.emplace_back("thumb", file->data, true, file->mimeType, file->fileName);
    } else /* std::string */ {
        auto thumbStr = boost::get<std::string>(thumb);
        if (!thumbStr.empty()) {
            args.emplace_back("thumb", thumbStr);
        }
    }
    if (replyMarkup) {
        args.emplace_back("reply_markup", _tgTypeParser.parseGenericReply(replyMarkup));
    }
    if (replyToMessageId) {
        args.emplace_back("reply_to_message_id", replyToMessageId);
    }
    return _tgTypeParser.parseJsonAndGetMessage(sendRequest("sendVideoNote", args));
}